

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ast::anon_unknown_103::GetDefaultVisitor::visit<slang::ast::LocalAssertionVarSymbol>
          (ConstantValue *__return_storage_ptr__,GetDefaultVisitor *this,
          LocalAssertionVarSymbol *type)

{
  undefined8 *puVar1;
  logic_error *this_00;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  long *plVar5;
  ulong uVar6;
  string __str;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/Type.cpp"
             ,"");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
  local_d0 = (ulong *)*plVar2;
  puVar4 = (ulong *)(plVar2 + 2);
  if (local_d0 == puVar4) {
    local_c0 = *puVar4;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar4;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\x02');
  *(undefined2 *)local_b0 = 0x3933;
  uVar6 = 0xf;
  if (local_d0 != &local_c0) {
    uVar6 = local_c0;
  }
  if (uVar6 < (ulong)(local_a8 + local_c8)) {
    uVar6 = 0xf;
    if (local_b0 != local_a0) {
      uVar6 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_c8) <= uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_002087da;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_002087da:
  local_f0 = (undefined8 *)*puVar3;
  puVar1 = puVar3 + 2;
  if (local_f0 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar1;
  }
  local_e8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_90 = (long *)*plVar2;
  plVar5 = plVar2 + 2;
  if (local_90 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_50 = (long *)*plVar2;
  plVar5 = plVar2 + 2;
  if (local_50 == plVar5) {
    local_40 = *plVar5;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar5;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

ConstantValue visit([[maybe_unused]] const T& type) {
        if constexpr (is_detected_v<getDefault_t, T>) {
            return type.getDefaultValueImpl();
        }
        else {
            ASSUME_UNREACHABLE;
        }
    }